

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O2

int32_t __thiscall spvtools::opt::analysis::IntConstant::GetS32BitValue(IntConstant *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar1 = (*(this->super_ScalarConstant).super_Constant._vptr_Constant[0x18])();
  if (((long *)CONCAT44(extraout_var,iVar1))[1] - *(long *)CONCAT44(extraout_var,iVar1) == 4) {
    iVar1 = (*(this->super_ScalarConstant).super_Constant._vptr_Constant[0x18])(this);
    return **(int32_t **)CONCAT44(extraout_var_00,iVar1);
  }
  __assert_fail("words().size() == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/constants.h"
                ,0xcb,"int32_t spvtools::opt::analysis::IntConstant::GetS32BitValue() const");
}

Assistant:

int32_t GetS32BitValue() const {
    // Relies on signed values smaller than 32-bit being sign extended.  See
    // section 2.2.1 of the SPIR-V spec.
    assert(words().size() == 1);
    return words()[0];
  }